

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O2

NetAddress * __thiscall miniros::network::NetAddress::operator=(NetAddress *this,NetAddress *other)

{
  Type TVar1;
  Type TVar2;
  void *__dest;
  size_t __n;
  
  if (this != other) {
    reset(this);
    TVar2 = AddressInvalid;
    if ((other->rawAddress != (void *)0x0) &&
       (TVar1 = other->type, TVar2 = AddressInvalid, TVar1 - AddressIPv4 < 2)) {
      __dest = malloc(0x10);
      this->rawAddress = __dest;
      __n = 0x1c;
      if (TVar1 != AddressIPv6) {
        __n = 0;
      }
      if (TVar1 == AddressIPv4) {
        __n = 0x10;
      }
      memcpy(__dest,other->rawAddress,__n);
      TVar2 = TVar1;
    }
    this->type = TVar2;
    this->port = other->port;
    std::__cxx11::string::_M_assign((string *)&this->address);
  }
  return this;
}

Assistant:

NetAddress& NetAddress::operator=(const NetAddress& other)
{
  if (this == &other)
    return *this;
  reset();

  if (other.rawAddress && (other.type == Type::AddressIPv4 || other.type == Type::AddressIPv6)) {
    sockaddr_in* addr = static_cast<sockaddr_in*>(malloc(sizeof(sockaddr_in)));
    rawAddress = addr;
    memcpy(rawAddress, other.rawAddress, getAddressSize(other.type));
    type = other.type;
  } else {
    type = Type::AddressInvalid;
  }
  port = other.port;
  address = other.address;
  return *this;
}